

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O0

bool __thiscall OpenMD::BaseAtomVisitor::isVisited(BaseAtomVisitor *this,Atom *atom)

{
  bool bVar1;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  shared_ptr<OpenMD::GenericData> *this_00;
  StuntDouble *in_stack_ffffffffffffff78;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  shared_ptr<OpenMD::GenericData> local_30 [3];
  
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x3466a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  StuntDouble::getPropertyByName(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = local_30;
  std::shared_ptr<OpenMD::GenericData>::operator=(this_00,in_stack_ffffffffffffff68);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34670e);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  bVar1 = std::operator==(this_00,in_stack_ffffffffffffff68);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x346740);
  return (bool)(bVar1 - 1U & 1);
}

Assistant:

bool BaseAtomVisitor::isVisited(Atom* atom) {
    std::shared_ptr<GenericData> data;
    data = atom->getPropertyByName("VISITED");
    return data == nullptr ? false : true;
  }